

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_fix.cpp
# Opt level: O3

void Omega_h::fix(Mesh *mesh,AdaptOpts *adapt_opts,Omega_h_Isotropy isotropy,bool verbose)

{
  uint uVar1;
  bool bVar2;
  undefined7 in_register_00000009;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  
  if ((int)CONCAT71(in_register_00000009,verbose) == 0) {
LAB_002c4a32:
    bVar2 = false;
  }
  else {
    bVar2 = can_print(mesh);
    if (!bVar2) goto LAB_002c4a32;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Computing bad-mesh \"implied\" metric\n",0x24);
    bVar2 = true;
  }
  uVar1 = mesh->dim_;
  if (uVar1 < 4) {
    if (uVar1 == 1) {
      compute_ill_metric_dim<1>(mesh,adapt_opts,isotropy);
    }
    else if (uVar1 == 2) {
      compute_ill_metric_dim<2>(mesh,adapt_opts,isotropy);
    }
    else {
      if (uVar1 != 3) {
        pcVar5 = "false";
        pcVar4 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_fix.cpp"
        ;
        uVar3 = 0x4f;
        goto LAB_002c4ac7;
      }
      compute_ill_metric_dim<3>(mesh,adapt_opts,isotropy);
    }
    fix_for_given_metric(mesh,adapt_opts,bVar2);
    return;
  }
  pcVar5 = "0 <= dim_ && dim_ <= 3";
  pcVar4 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp";
  uVar3 = 0x33;
LAB_002c4ac7:
  fail("assertion %s failed at %s +%d\n",pcVar5,pcVar4,uVar3);
}

Assistant:

void fix(Mesh* mesh, AdaptOpts const& adapt_opts, Omega_h_Isotropy isotropy,
    bool verbose) {
  verbose = verbose && can_print(mesh);
  if (verbose) std::cout << "Computing bad-mesh \"implied\" metric\n";
  compute_ill_metric(mesh, adapt_opts, isotropy);
  fix_for_given_metric(mesh, adapt_opts, verbose);
  // TODO: commenting this out because metric quality corrections assume
  // isotropy!!! we need to fix this, but for now just skip this step
  if ((0)) {
    if (verbose) std::cout << "Computing more typical \"implied\" metric\n";
    compute_typical_metric(mesh, isotropy);
    fix_for_given_metric(mesh, adapt_opts, verbose);
  }
}